

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall QTableModel::isValid(QTableModel *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  long lVar4;
  QModelIndex *in_RSI;
  long in_RDI;
  QModelIndex *in_stack_ffffffffffffffd0;
  undefined1 local_11;
  
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffffd0);
  local_11 = false;
  if (bVar1) {
    iVar2 = QModelIndex::row(in_RSI);
    qVar3 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x30));
    local_11 = false;
    if (iVar2 < qVar3) {
      iVar2 = QModelIndex::column(in_RSI);
      lVar4 = (long)iVar2;
      qVar3 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x48));
      local_11 = lVar4 < qVar3;
    }
  }
  return local_11;
}

Assistant:

bool QTableModel::isValid(const QModelIndex &index) const
{
    return (index.isValid()
            && index.row() < verticalHeaderItems.size()
            && index.column() < horizontalHeaderItems.size());
}